

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool __thiscall mkvparser::Tags::Tag::ExpandSimpleTagsArray(Tag *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  SimpleTag *pSVar5;
  undefined8 uVar6;
  long *plVar7;
  ulong uVar8;
  bool bVar9;
  int iVar10;
  ulong uVar11;
  
  iVar3 = this->m_simple_tags_size;
  uVar4 = this->m_simple_tags_count;
  bVar9 = true;
  if (iVar3 <= (int)uVar4) {
    iVar10 = 1;
    if (iVar3 != 0) {
      iVar10 = iVar3 * 2;
    }
    uVar8 = 0xffffffffffffffff;
    if (-1 < iVar10) {
      uVar8 = (long)iVar10 << 4 | 8;
    }
    plVar7 = (long *)operator_new__(uVar8,(nothrow_t *)&std::nothrow);
    uVar8 = 0;
    if (plVar7 == (long *)0x0) {
      bVar9 = false;
    }
    else {
      *plVar7 = (long)iVar10;
      pSVar5 = this->m_simple_tags;
      uVar11 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar11 = uVar8;
      }
      for (; uVar11 * 0x10 != uVar8; uVar8 = uVar8 + 0x10) {
        puVar1 = (undefined8 *)((long)&pSVar5->m_tag_name + uVar8);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&((SimpleTag *)(plVar7 + 1))->m_tag_name + uVar8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
      }
      if (pSVar5 != (SimpleTag *)0x0) {
        operator_delete__(&pSVar5[-1].m_tag_string);
      }
      this->m_simple_tags = (SimpleTag *)(plVar7 + 1);
      this->m_simple_tags_size = iVar10;
    }
  }
  return bVar9;
}

Assistant:

bool Tags::Tag::ExpandSimpleTagsArray() {
  if (m_simple_tags_size > m_simple_tags_count)
    return true;  // nothing else to do

  const int size = (m_simple_tags_size == 0) ? 1 : 2 * m_simple_tags_size;

  SimpleTag* const displays = new (std::nothrow) SimpleTag[size];

  if (displays == NULL)
    return false;

  for (int idx = 0; idx < m_simple_tags_count; ++idx) {
    m_simple_tags[idx].ShallowCopy(displays[idx]);
  }

  delete[] m_simple_tags;
  m_simple_tags = displays;

  m_simple_tags_size = size;
  return true;
}